

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_42055d::ExpandedSpecialSubstitution::printLeft
          (ExpandedSpecialSubstitution *this,OutputStream *S)

{
  char *pcVar1;
  char *pcVar2;
  size_t sVar3;
  long lVar4;
  undefined4 uVar5;
  
  switch(*(undefined4 *)&(this->super_Node).field_0xc) {
  case 0:
  case 1:
  case 2:
    lVar4 = 0x46;
    OutputStream::grow(S,0x46);
    memcpy(S->Buffer + S->CurrentPosition,
           "std::basic_string<char, std::char_traits<char>, std::allocator<char> >",0x46);
    break;
  case 3:
    OutputStream::grow(S,0x31);
    pcVar2 = S->Buffer;
    sVar3 = S->CurrentPosition;
    builtin_strncpy(pcVar2 + sVar3 + 0x10,"am<char, std::char_traits<char> ",0x20);
    uVar5._0_1_ = 'i';
    uVar5._1_1_ = 'c';
    uVar5._2_1_ = '_';
    uVar5._3_1_ = 'i';
    goto LAB_001a03b3;
  case 4:
    OutputStream::grow(S,0x31);
    pcVar2 = S->Buffer;
    sVar3 = S->CurrentPosition;
    builtin_strncpy(pcVar2 + sVar3 + 0x10,"am<char, std::char_traits<char> ",0x20);
    uVar5._0_1_ = 'i';
    uVar5._1_1_ = 'c';
    uVar5._2_1_ = '_';
    uVar5._3_1_ = 'o';
LAB_001a03b3:
    lVar4 = 0x31;
    pcVar1 = pcVar2 + sVar3;
    pcVar1[0] = 's';
    pcVar1[1] = 't';
    pcVar1[2] = 'd';
    pcVar1[3] = ':';
    pcVar1[4] = ':';
    pcVar1[5] = 'b';
    pcVar1[6] = 'a';
    pcVar1[7] = 's';
    *(undefined4 *)(pcVar1 + 8) = uVar5;
    pcVar1[0xc] = 's';
    pcVar1[0xd] = 't';
    pcVar1[0xe] = 'r';
    pcVar1[0xf] = 'e';
    pcVar2[sVar3 + 0x30] = '>';
    break;
  case 5:
    lVar4 = 0x32;
    OutputStream::grow(S,0x32);
    builtin_strncpy(S->Buffer + S->CurrentPosition,
                    "std::basic_iostream<char, std::char_traits<char> >",0x32);
    break;
  default:
    goto switchD_001a02b4_default;
  }
  S->CurrentPosition = S->CurrentPosition + lVar4;
switchD_001a02b4_default:
  return;
}

Assistant:

void printLeft(OutputStream &S) const override {
    switch (SSK) {
    case SpecialSubKind::allocator:
      S += "std::basic_string<char, std::char_traits<char>, "
           "std::allocator<char> >";
      break;
    case SpecialSubKind::basic_string:
    case SpecialSubKind::string:
      S += "std::basic_string<char, std::char_traits<char>, "
           "std::allocator<char> >";
      break;
    case SpecialSubKind::istream:
      S += "std::basic_istream<char, std::char_traits<char> >";
      break;
    case SpecialSubKind::ostream:
      S += "std::basic_ostream<char, std::char_traits<char> >";
      break;
    case SpecialSubKind::iostream:
      S += "std::basic_iostream<char, std::char_traits<char> >";
      break;
    }
  }